

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapterbase.h
# Opt level: O2

void __thiscall bgui::ImageAdapterBase::setRotationFlip(ImageAdapterBase *this,int r,bool f)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  this->rotation = r & 3;
  this->flip = f;
  gmath::SMatrix<long,_2,_3>::operator=(&this->R,0);
  iVar1 = this->rotation;
  if (iVar1 == 1) {
    (this->R).v[0][1] = 1;
    (this->R).v[1][0] = -1;
    iVar1 = (*this->_vptr_ImageAdapterBase[6])(this);
    (this->R).v[1][2] = CONCAT44(extraout_var_03,iVar1) + -1;
    if (this->flip == true) {
      (this->R).v[1][0] = 1;
      (this->R).v[1][2] = 0;
    }
  }
  else if (iVar1 == 2) {
    (this->R).v[0][0] = -1;
    iVar1 = (*this->_vptr_ImageAdapterBase[5])(this);
    (this->R).v[0][2] = CONCAT44(extraout_var_01,iVar1) + -1;
    (this->R).v[1][1] = -1;
    iVar1 = (*this->_vptr_ImageAdapterBase[6])(this);
    (this->R).v[1][2] = CONCAT44(extraout_var_02,iVar1) + -1;
    if (this->flip == true) {
      (this->R).v[0][0] = 1;
      (this->R).v[0][2] = 0;
    }
  }
  else if (iVar1 == 3) {
    (this->R).v[0][1] = -1;
    iVar1 = (*this->_vptr_ImageAdapterBase[5])(this);
    (this->R).v[0][2] = CONCAT44(extraout_var,iVar1) + -1;
    (this->R).v[1][0] = 1;
    if (this->flip == true) {
      (this->R).v[1][0] = -1;
      iVar1 = (*this->_vptr_ImageAdapterBase[6])(this);
      (this->R).v[1][2] = CONCAT44(extraout_var_00,iVar1) + -1;
    }
  }
  else {
    (this->R).v[0][0] = 1;
    (this->R).v[1][1] = 1;
    if (this->flip == true) {
      (this->R).v[0][0] = -1;
      iVar1 = (*this->_vptr_ImageAdapterBase[5])(this);
      (this->R).v[0][2] = CONCAT44(extraout_var_04,iVar1) + -1;
    }
  }
  return;
}

Assistant:

void setRotationFlip(int r, bool f)
    {
      rotation=(r & 3);
      flip=f;

      R=0;

      switch (rotation)
      {
        default:
        case 0:
          R(0, 0)=1;
          R(1, 1)=1;

          if (flip)
          {
            R(0, 0)=-1;
            R(0, 2)=getOriginalWidth()-1;
          }

          break;

        case 1:
          R(0, 1)=1;
          R(1, 0)=-1;
          R(1, 2)=getOriginalHeight()-1;

          if (flip)
          {
            R(1, 0)=1;
            R(1, 2)=0;
          }

          break;

        case 2:
          R(0, 0)=-1;
          R(0, 2)=getOriginalWidth()-1;
          R(1, 1)=-1;
          R(1, 2)=getOriginalHeight()-1;

          if (flip)
          {
            R(0, 0)=1;
            R(0, 2)=0;
          }

          break;

        case 3:
          R(0, 1)=-1;
          R(0, 2)=getOriginalWidth()-1;
          R(1, 0)=1;

          if (flip)
          {
            R(1, 0)=-1;
            R(1, 2)=getOriginalHeight()-1;
          }

          break;
      }
    }